

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

char * iniparser_getsecname(dictionary *d,int n)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  pcVar5 = (char *)0x0;
  if (-1 < n && d != (dictionary *)0x0) {
    lVar1 = d->size;
    lVar7 = 0;
    while ((uVar4 = (uint)pcVar5, lVar6 = lVar1, uVar3 = uVar4, lVar1 != lVar7 &&
           (((d->key[lVar7] == (char *)0x0 ||
             (pcVar5 = strchr(d->key[lVar7],0x3a), pcVar5 != (char *)0x0)) ||
            (uVar3 = uVar4 + 1, bVar2 = (int)uVar4 < n, lVar6 = lVar7, uVar4 = uVar3, bVar2))))) {
      lVar7 = lVar7 + 1;
      pcVar5 = (char *)(ulong)uVar4;
    }
    if (n < (int)uVar3) {
      pcVar5 = d->key[lVar6];
    }
    else {
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

const char * iniparser_getsecname(const dictionary * d, int n)
{
    size_t i ;
    int foundsec ;

    if (d==NULL || n<0) return NULL ;
    foundsec=0 ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (strchr(d->key[i], ':')==NULL) {
            foundsec++ ;
            if (foundsec>n)
                break ;
        }
    }
    if (foundsec<=n) {
        return NULL ;
    }
    return d->key[i] ;
}